

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void print_http_error(Curl_easy *data)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  char *local_30;
  char *end;
  char end_char;
  char *beg;
  SingleRequest *k;
  Curl_easy *data_local;
  
  pcVar2 = (data->req).p;
  iVar1 = strncmp(pcVar2,"HTTP",4);
  if (((iVar1 == 0) && (pcVar2 = strchr(pcVar2,0x20), pcVar2 != (char *)0x0)) &&
     (__s = pcVar2 + 1, pcVar2[1] != '\0')) {
    end._7_1_ = '\r';
    local_30 = strchr(__s,0xd);
    if (local_30 == (char *)0x0) {
      end._7_1_ = '\n';
      local_30 = strchr(__s,10);
    }
    if (local_30 != (char *)0x0) {
      *local_30 = '\0';
      Curl_failf(data,"The requested URL returned error: %s",__s);
      *local_30 = end._7_1_;
      return;
    }
  }
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return;
}

Assistant:

static void print_http_error(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  char *beg = k->p;

  /* make sure that data->req.p points to the HTTP status line */
  if(!strncmp(beg, "HTTP", 4)) {

    /* skip to HTTP status code */
    beg = strchr(beg, ' ');
    if(beg && *++beg) {

      /* find trailing CR */
      char end_char = '\r';
      char *end = strchr(beg, end_char);
      if(!end) {
        /* try to find LF (workaround for non-compliant HTTP servers) */
        end_char = '\n';
        end = strchr(beg, end_char);
      }

      if(end) {
        /* temporarily replace CR or LF by NUL and print the error message */
        *end = '\0';
        failf(data, "The requested URL returned error: %s", beg);

        /* restore the previously replaced CR or LF */
        *end = end_char;
        return;
      }
    }
  }

  /* fall-back to printing the HTTP status code only */
  failf(data, "The requested URL returned error: %d", k->httpcode);
}